

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# axl_spy_ImportEnumerator.cpp
# Opt level: O0

bool __thiscall axl::spy::ImportIterator::readRel(ImportIterator *this)

{
  ulong uVar1;
  long lVar2;
  ElfImportEnumeration *pEVar3;
  C *p;
  long in_RDI;
  Elf64_Sym *sym;
  size_t symIdx;
  ElfRel *end;
  ElfRel *rel;
  int relType;
  StringRef *in_stack_ffffffffffffff58;
  StringRefBase<char,_axl::sl::StringDetailsBase<char>_> *pSVar4;
  StringRefBase<char,_axl::sl::StringDetailsBase<char>_> *in_stack_ffffffffffffff70;
  ImportIteratorBase *in_stack_ffffffffffffffc0;
  ElfRel *local_28;
  ElfRel *local_20;
  undefined4 in_stack_ffffffffffffffe8;
  int iVar5;
  bool local_1;
  
  uVar1 = *(ulong *)(in_RDI + 0x58);
  pEVar3 = rc::Ptr<axl::spy::ElfImportEnumeration>::operator->
                     ((Ptr<axl::spy::ElfImportEnumeration> *)(in_RDI + 0x48));
  if (uVar1 < pEVar3->m_pltRelCount) {
    iVar5 = 7;
    pEVar3 = rc::Ptr<axl::spy::ElfImportEnumeration>::operator->
                       ((Ptr<axl::spy::ElfImportEnumeration> *)(in_RDI + 0x48));
    local_20 = pEVar3->m_pltRelTable;
    pEVar3 = rc::Ptr<axl::spy::ElfImportEnumeration>::operator->
                       ((Ptr<axl::spy::ElfImportEnumeration> *)(in_RDI + 0x48));
    local_28 = local_20 + pEVar3->m_pltRelCount;
    local_20 = local_20 + *(long *)(in_RDI + 0x58);
  }
  else {
    iVar5 = 6;
    pEVar3 = rc::Ptr<axl::spy::ElfImportEnumeration>::operator->
                       ((Ptr<axl::spy::ElfImportEnumeration> *)(in_RDI + 0x48));
    pSVar4 = (StringRefBase<char,_axl::sl::StringDetailsBase<char>_> *)pEVar3->m_gotRelTable;
    in_stack_ffffffffffffff70 = pSVar4;
    pEVar3 = rc::Ptr<axl::spy::ElfImportEnumeration>::operator->
                       ((Ptr<axl::spy::ElfImportEnumeration> *)(in_RDI + 0x48));
    local_28 = (ElfRel *)(&in_stack_ffffffffffffff70->m_p + pEVar3->m_gotRelCount * 3);
    lVar2 = *(long *)(in_RDI + 0x58);
    pEVar3 = rc::Ptr<axl::spy::ElfImportEnumeration>::operator->
                       ((Ptr<axl::spy::ElfImportEnumeration> *)(in_RDI + 0x48));
    local_20 = (ElfRel *)((lVar2 - pEVar3->m_pltRelCount) * 0x18 + (long)pSVar4);
  }
  do {
    if (local_28 <= local_20) {
      if (iVar5 == 7) {
        local_1 = readRel((ImportIterator *)CONCAT44(7,in_stack_ffffffffffffffe8));
      }
      else {
        ImportIteratorBase::reset(in_stack_ffffffffffffffc0);
        local_1 = false;
      }
      return local_1;
    }
    if ((local_20->r_info & 0xffffffff) == (long)iVar5) {
      uVar1 = local_20->r_info;
      pEVar3 = rc::Ptr<axl::spy::ElfImportEnumeration>::operator->
                         ((Ptr<axl::spy::ElfImportEnumeration> *)(in_RDI + 0x48));
      if ((pEVar3->m_symbolTable[uVar1 >> 0x20].st_info & 0xf) == 2) {
        p = (C *)(ulong)pEVar3->m_symbolTable[uVar1 >> 0x20].st_name;
        pEVar3 = rc::Ptr<axl::spy::ElfImportEnumeration>::operator->
                           ((Ptr<axl::spy::ElfImportEnumeration> *)(in_RDI + 0x48));
        if (p < (C *)pEVar3->m_stringTableSize) {
          rc::Ptr<axl::spy::ElfImportEnumeration>::operator->
                    ((Ptr<axl::spy::ElfImportEnumeration> *)(in_RDI + 0x48));
          pSVar4 = (StringRefBase<char,_axl::sl::StringDetailsBase<char>_> *)
                   &stack0xffffffffffffffa8;
          sl::StringRefBase<char,_axl::sl::StringDetailsBase<char>_>::StringRefBase
                    (in_stack_ffffffffffffff70,p);
          sl::StringRefBase<char,_axl::sl::StringDetailsBase<char>_>::operator=
                    (pSVar4,in_stack_ffffffffffffff58);
          sl::StringRefBase<char,_axl::sl::StringDetailsBase<char>_>::~StringRefBase
                    ((StringRefBase<char,_axl::sl::StringDetailsBase<char>_> *)0x1528c3);
          pEVar3 = rc::Ptr<axl::spy::ElfImportEnumeration>::operator->
                             ((Ptr<axl::spy::ElfImportEnumeration> *)(in_RDI + 0x48));
          *(size_t *)(in_RDI + 0x40) = pEVar3->m_baseAddress + local_20->r_offset;
          return true;
        }
      }
    }
    local_20 = local_20 + 1;
    *(long *)(in_RDI + 0x58) = *(long *)(in_RDI + 0x58) + 1;
  } while( true );
}

Assistant:

bool
ImportIterator::readRel() {
	ASSERT(m_enumeration && "attempt to read ElfRel from a null-iterator");

	int relType;
	ElfRel* rel;
	ElfRel* end;

	if (m_index < m_enumeration->m_pltRelCount) {
		relType = R_JUMP_SLOT;
		rel = m_enumeration->m_pltRelTable;
		end = rel + m_enumeration->m_pltRelCount;
		rel += m_index;
	} else {
		relType = R_GLOB_DAT;
		rel = m_enumeration->m_gotRelTable;
		end = rel + m_enumeration->m_gotRelCount;
		rel += m_index - m_enumeration->m_pltRelCount;
	}

	for (; rel < end; rel++, m_index++) {
		if (ELF_R_TYPE(rel->r_info) != relType)
			continue;

		size_t symIdx = ELF_R_SYM(rel->r_info);
		ElfW(Sym)* sym = m_enumeration->m_symbolTable + symIdx;
		if (ELF_ST_TYPE(sym->st_info) != STT_FUNC)
			continue;

		if (sym->st_name >= m_enumeration->m_stringTableSize) {
			AXL_TRACE("WARNING: ImportIterator::readRel: symbol out of string table\n");
			continue;
		}

		m_symbolName = m_enumeration->m_stringTable + sym->st_name;
		m_slot = (void**)(m_enumeration->m_baseAddress + rel->r_offset);
		return true;
	}

	if (relType == R_JUMP_SLOT)
		return readRel(); // retry with GOT

	reset();
	return false;
}